

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::LabelTextV(char *label,char *fmt,__va_list_tag *args)

{
  float fVar1;
  ImGuiContext *pIVar2;
  char *text;
  bool bVar3;
  int iVar4;
  ImGuiWindow *pIVar5;
  char *text_end;
  float _x;
  float local_dc;
  ImVec2 local_b0;
  ImVec2 local_a8;
  char *local_a0;
  char *value_text_end;
  char *value_text_begin;
  ImVec2 local_84;
  ImVec2 local_7c;
  undefined1 local_74 [8];
  ImRect total_bb;
  ImVec2 local_5c;
  undefined1 local_54 [8];
  ImRect value_bb;
  ImVec2 label_size;
  float w;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  __va_list_tag *args_local;
  char *fmt_local;
  char *label_local;
  
  pIVar5 = GetCurrentWindow();
  pIVar2 = GImGui;
  if ((pIVar5->SkipItems & 1U) == 0) {
    _x = CalcItemWidth();
    value_bb.Max = CalcTextSize(label,(char *)0x0,true,-1.0);
    fVar1 = (pIVar2->Style).FramePadding.y;
    ImVec2::ImVec2(&total_bb.Max,_x,fVar1 + fVar1 + value_bb.Max.y);
    local_5c = ::operator+(&(pIVar5->DC).CursorPos,&total_bb.Max);
    ImRect::ImRect((ImRect *)local_54,&(pIVar5->DC).CursorPos,&local_5c);
    if (value_bb.Max.x <= 0.0) {
      local_dc = 0.0;
    }
    else {
      local_dc = (pIVar2->Style).ItemInnerSpacing.x;
    }
    fVar1 = (pIVar2->Style).FramePadding.y;
    ImVec2::ImVec2((ImVec2 *)((long)&value_text_begin + 4),_x + local_dc,fVar1 + fVar1);
    local_84 = ::operator+(&(pIVar5->DC).CursorPos,(ImVec2 *)((long)&value_text_begin + 4));
    local_7c = ::operator+(&local_84,&value_bb.Max);
    ImRect::ImRect((ImRect *)local_74,&(pIVar5->DC).CursorPos,&local_7c);
    ItemSize((ImRect *)local_74,(pIVar2->Style).FramePadding.y);
    bVar3 = ItemAdd((ImRect *)local_74,0,(ImRect *)0x0);
    if (bVar3) {
      value_text_end = pIVar2->TempBuffer;
      iVar4 = ImFormatStringV(pIVar2->TempBuffer,0xc01,fmt,args);
      text = value_text_end;
      text_end = pIVar2->TempBuffer + iVar4;
      local_a0 = text_end;
      ImVec2::ImVec2(&local_a8,0.0,0.5);
      RenderTextClipped((ImVec2 *)local_54,&value_bb.Min,text,text_end,(ImVec2 *)0x0,&local_a8,
                        (ImRect *)0x0);
      if (0.0 < value_bb.Max.x) {
        ImVec2::ImVec2(&local_b0,value_bb.Min.x + (pIVar2->Style).ItemInnerSpacing.x,
                       (float)local_54._4_4_ + (pIVar2->Style).FramePadding.y);
        RenderText(local_b0,label,(char *)0x0,true);
      }
    }
  }
  return;
}

Assistant:

void ImGui::LabelTextV(const char* label, const char* fmt, va_list args)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const float w = CalcItemWidth();

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const ImRect value_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y*2));
    const ImRect total_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w + (label_size.x > 0.0f ? style.ItemInnerSpacing.x : 0.0f), style.FramePadding.y*2) + label_size);
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, 0))
        return;

    // Render
    const char* value_text_begin = &g.TempBuffer[0];
    const char* value_text_end = value_text_begin + ImFormatStringV(g.TempBuffer, IM_ARRAYSIZE(g.TempBuffer), fmt, args);
    RenderTextClipped(value_bb.Min, value_bb.Max, value_text_begin, value_text_end, NULL, ImVec2(0.0f,0.5f));
    if (label_size.x > 0.0f)
        RenderText(ImVec2(value_bb.Max.x + style.ItemInnerSpacing.x, value_bb.Min.y + style.FramePadding.y), label);
}